

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_scalar_split(void *arg,int iters)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  secp256k1_scalar tmp;
  secp256k1_scalar local_50;
  
  iVar2 = 0;
  iVar3 = 0;
  if (0 < iters) {
    iVar3 = iters;
  }
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    secp256k1_scalar_split_lambda
              (&local_50,(secp256k1_scalar *)((long)arg + 0x20),(secp256k1_scalar *)arg);
    iVar1 = secp256k1_scalar_add
                      ((secp256k1_scalar *)arg,&local_50,(secp256k1_scalar *)((long)arg + 0x20));
    iVar2 = iVar2 + iVar1;
  }
  if (iVar2 <= iters) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench_internal.c"
          ,0x96,"test condition failed: j <= iters");
  abort();
}

Assistant:

static void bench_scalar_split(void* arg, int iters) {
    int i, j = 0;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_scalar tmp;

    for (i = 0; i < iters; i++) {
        secp256k1_scalar_split_lambda(&tmp, &data->scalar[1], &data->scalar[0]);
        j += secp256k1_scalar_add(&data->scalar[0], &tmp, &data->scalar[1]);
    }
    CHECK(j <= iters);
}